

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O3

void __thiscall
QStyledItemDelegate::updateEditorGeometry
          (QStyledItemDelegate *this,QWidget *editor,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  QWidget *this_00;
  int iVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QStyleOptionViewItem opt;
  QRect local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (editor != (QWidget *)0x0) {
    this_00 = option->widget;
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108,option);
    (**(code **)(*(long *)this + 0xb8))(this,&local_108,index);
    pQVar2 = QWidget::style(editor);
    iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x3c,0,editor,0);
    local_108.showDecorationSelected = iVar1 != 0;
    if (this_00 == (QWidget *)0x0) {
      pQVar2 = QApplication::style();
    }
    else {
      pQVar2 = QWidget::style(this_00);
    }
    local_118 = (QRect)(**(code **)(*(long *)pQVar2 + 0xc0))(pQVar2,0x2e,&local_108,this_00);
    QWidget::setGeometry(editor,&local_118);
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::updateEditorGeometry(QWidget *editor,
                                         const QStyleOptionViewItem &option,
                                         const QModelIndex &index) const
{
    if (!editor)
        return;
    Q_ASSERT(index.isValid());
    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);
    opt.showDecorationSelected = editor->style()->styleHint(QStyle::SH_ItemView_ShowDecorationSelected, nullptr, editor);

    QStyle *style = widget ? widget->style() : QApplication::style();
    QRect geom = style->subElementRect(QStyle::SE_ItemViewItemText, &opt, widget);
    editor->setGeometry(geom);
}